

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::DrawMesh(DeviceContextGLImpl *this,DrawMeshAttribs *Attribs)

{
  string msg;
  string local_28;
  
  FormatString<char[36]>(&local_28,(char (*) [36])"DrawMesh is not supported in OpenGL");
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"DrawMesh",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
             ,0x537);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void DeviceContextGLImpl::DrawMesh(const DrawMeshAttribs& Attribs)
{
    UNSUPPORTED("DrawMesh is not supported in OpenGL");
}